

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void gl4cts::EnhancedLayouts::Utils::Texture::Storage
               (Functions *gl,TYPES tex_type,GLuint width,GLuint height,GLuint depth,
               GLenum internal_format)

{
  GLenum GVar1;
  TestError *this;
  int line;
  char *msg;
  
  if (TEX_1D_ARRAY < tex_type) {
LAB_0088c52a:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invliad enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xd35);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar1 = *(GLenum *)(&DAT_01a54fe0 + (ulong)tex_type * 4);
  if ((0xa6U >> (tex_type & 0x1f) & 1) == 0) {
    if ((0x18U >> (tex_type & 0x1f) & 1) == 0) {
      if (tex_type != TEX_1D) goto LAB_0088c52a;
      (*gl->texStorage1D)(GVar1,1,internal_format,width);
      GVar1 = (*gl->getError)();
      msg = "TexStorage1D";
      line = 0xd26;
    }
    else {
      (*gl->texStorage3D)(GVar1,1,internal_format,width,height,depth);
      GVar1 = (*gl->getError)();
      msg = "TexStorage3D";
      line = 0xd32;
    }
  }
  else {
    (*gl->texStorage2D)(GVar1,1,internal_format,width,height);
    GVar1 = (*gl->getError)();
    msg = "TexStorage2D";
    line = 0xd2d;
  }
  glu::checkError(GVar1,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,line);
  return;
}

Assistant:

void Texture::Storage(const Functions& gl, TYPES tex_type, GLuint width, GLuint height, GLuint depth,
					  GLenum internal_format)
{
	static const GLuint levels = 1;

	GLenum target = GetTargetGLenum(tex_type);

	switch (tex_type)
	{
	case TEX_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case TEX_2D:
	case TEX_1D_ARRAY:
	case TEX_2D_RECT:
	case TEX_CUBE:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case TEX_3D:
	case TEX_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}